

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O2

FADFADSTATE * FADatan(FADFADSTATE *__return_storage_ptr__,FADFADSTATE *x)

{
  Fad<double> *x_00;
  uint sz;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  Fad<double> fadres;
  Fad<double> *local_d8;
  Fad<double> *local_d0;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
  local_c8;
  FadExpr<FadFuncAtan<Fad<double>_>_> local_b8;
  Fad<double> local_90;
  double local_70 [3];
  Fad<double> **local_58;
  Fad<double> local_50;
  
  x_00 = &x->val_;
  atan<double>(&local_b8,x_00);
  Fad<double>::Fad<FadFuncAtan<Fad<double>>>(&local_90,&local_b8);
  Fad<double>::~Fad(&local_b8.fadexpr_.expr_);
  sz = (x->dx_).num_elts;
  Fad<Fad<double>_>::Fad(__return_storage_ptr__,sz,&local_90);
  uVar1 = 0;
  uVar3 = (ulong)sz;
  if ((int)sz < 1) {
    uVar3 = uVar1;
  }
  for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    local_70[1] = 1.0;
    local_70[2] = 0.0;
    local_58 = &local_d8;
    local_b8.fadexpr_.expr_.val_ = 1.0;
    local_b8.fadexpr_.expr_.dx_.num_elts = 0;
    local_b8.fadexpr_.expr_.dx_._4_4_ = 0;
    local_b8.fadexpr_.expr_.dx_.ptr_to_data = local_70;
    local_d8 = x_00;
    local_d0 = x_00;
    Fad<Fad<double>_>::dx(&local_50,x,(int)uVar2);
    local_c8.fadexpr_.left_ =
         (FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
          *)&local_b8;
    local_c8.fadexpr_.right_ = &local_50;
    Fad<double>::operator=
              ((Fad<double> *)((long)&((__return_storage_ptr__->dx_).ptr_to_data)->val_ + uVar1),
               &local_c8);
    Fad<double>::~Fad(&local_50);
    uVar1 = uVar1 + 0x20;
  }
  Fad<double>::~Fad(&local_90);
  return __return_storage_ptr__;
}

Assistant:

static FADFADSTATE FADatan(FADFADSTATE x)
{
    Fad<STATE> fadres = atan(x.val());
    int sz = x.size();
    FADFADSTATE resa(sz,fadres);
    for (int i=0; i<sz; i++) {
        resa.fastAccessDx(i) = 1./(1.+x.val()*x.val())*x.dx(i);
    }
    return resa;
}